

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1da1d1::ClosureTypeName::printLeft(ClosureTypeName *this,OutputStream *S)

{
  StringView local_58;
  StringView local_48;
  char *local_38;
  char *local_30;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  ClosureTypeName *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"\'lambda");
  OutputStream::operator+=(local_18,local_28);
  local_38 = (this->Count).First;
  local_30 = (this->Count).Last;
  OutputStream::operator+=(local_18,this->Count);
  StringView::StringView(&local_48,"\'(");
  OutputStream::operator+=(local_18,local_48);
  NodeArray::printWithComma(&this->Params,local_18);
  StringView::StringView(&local_58,")");
  OutputStream::operator+=(local_18,local_58);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "\'lambda";
    S += Count;
    S += "\'(";
    Params.printWithComma(S);
    S += ")";
  }